

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_asof_join.cpp
# Opt level: O3

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::PlanAsOfJoin(PhysicalPlanGenerator *this,LogicalComparisonJoin *op)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  vector<unsigned_long,_true> *this_01;
  ExpressionType EVar2;
  pointer pJVar3;
  pointer pJVar4;
  pointer pLVar5;
  pointer pLVar6;
  iterator iVar7;
  iterator __position;
  LogicalComparisonJoin *args;
  PhysicalPlanGenerator *pPVar8;
  int iVar9;
  int iVar10;
  reference pvVar11;
  pointer pLVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  type pLVar13;
  reference pvVar14;
  ClientConfig *pCVar15;
  pointer pEVar16;
  pointer pBVar17;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var18;
  pointer pPVar19;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> _Var20;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var21;
  PhysicalOperator *args_2;
  BoundReferenceExpression *this_02;
  InternalException *pIVar22;
  size_type *psVar23;
  size_type sVar24;
  size_type sVar25;
  undefined1 *__n;
  optional_ptr<duckdb::PhysicalOperator,_true> result;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  window_select;
  vector<unsigned_long,_true> equi_indexes;
  LogicalType asof_type;
  idx_t rhs_cardinality;
  idx_t lhs_cardinality;
  _Head_base<0UL,_duckdb::BoundWindowExpression_*,_false> local_160;
  Value local_158;
  PhysicalOperator *local_118;
  vector<duckdb::JoinCondition,_true> *local_110;
  tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> local_108;
  BoundReferenceExpression *pBStack_100;
  char local_f8;
  reference local_e8;
  PhysicalOperator *local_e0;
  Value local_d8;
  size_type *local_98;
  iterator iStack_90;
  unsigned_long *local_88;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *local_78;
  LogicalType local_70;
  LogicalComparisonJoin *local_58;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_50;
  PhysicalPlanGenerator *local_48;
  unsigned_long local_40;
  ulong local_38;
  
  this_00 = &(op->super_LogicalJoin).super_LogicalOperator.children;
  pvVar11 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::operator[](this_00,0);
  pLVar12 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(pvVar11);
  iVar9 = (*pLVar12->_vptr_LogicalOperator[7])(pLVar12,this->context);
  local_38 = CONCAT44(extraout_var,iVar9);
  pvVar11 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::operator[](this_00,1);
  pLVar12 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(pvVar11);
  iVar10 = (*pLVar12->_vptr_LogicalOperator[7])(pLVar12);
  local_40 = CONCAT44(extraout_var_00,iVar10);
  pvVar11 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::operator[](this_00,0);
  pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(pvVar11);
  local_e0 = CreatePlan(this,pLVar13);
  local_78 = this_00;
  pvVar11 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::operator[](this_00,1);
  pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(pvVar11);
  local_118 = CreatePlan(this,pLVar13);
  local_88 = (unsigned_long *)0x0;
  local_98 = (size_type *)0x0;
  iStack_90._M_current = (size_type *)0x0;
  local_110 = &op->conditions;
  pJVar3 = (op->conditions).
           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pJVar4 = (op->conditions).
           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
           .super__Vector_impl_data._M_start;
  sVar24 = ((long)pJVar3 - (long)pJVar4 >> 3) * -0x5555555555555555;
  local_d8.type_.id_ = INVALID;
  local_d8.type_.physical_type_ = ~INVALID;
  local_d8.type_._2_6_ = 0;
  if (pJVar3 != pJVar4) {
    sVar25 = sVar24;
    do {
      pvVar14 = vector<duckdb::JoinCondition,_true>::operator[](local_110,local_d8.type_._0_8_);
      EVar2 = pvVar14->comparison;
      sVar24 = local_d8.type_._0_8_;
      if (3 < EVar2 - 0x1b) {
        if ((EVar2 != COMPARE_BOUNDARY_START) && (EVar2 != COMPARE_BOUNDARY_END)) {
          pIVar22 = (InternalException *)__cxa_allocate_exception(0x10);
          local_158.type_._0_8_ = (long)&local_158 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_158,"Invalid ASOF JOIN comparison","");
          InternalException::InternalException(pIVar22,(string *)&local_158);
          __cxa_throw(pIVar22,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        sVar24 = sVar25;
        if (iStack_90._M_current == local_88) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_98,iStack_90,
                     (unsigned_long *)&local_d8);
        }
        else {
          *iStack_90._M_current = local_d8.type_._0_8_;
          iStack_90._M_current = iStack_90._M_current + 1;
        }
      }
      local_d8.type_._0_8_ = local_d8.type_._0_8_ + 1;
      sVar25 = sVar24;
    } while ((ulong)local_d8.type_._0_8_ <
             (ulong)(((long)(op->conditions).
                            super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                            .
                            super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(op->conditions).
                            super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                            .
                            super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
  }
  pCVar15 = ClientConfig::GetConfig(this->context);
  if (pCVar15->force_asof_iejoin == false) {
    pvVar11 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::operator[](local_78,0);
    pLVar12 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->(pvVar11);
    if (((pLVar12->has_estimated_cardinality == true) &&
        (CONCAT44(extraout_var,iVar9) <= pCVar15->asof_loop_join_threshold)) &&
       (local_158.type_._0_8_ = PlanAsOfLoopJoin(this,op,local_e0,local_118),
       (PhysicalOperator *)local_158.type_._0_8_ != (PhysicalOperator *)0x0)) {
      optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid
                ((optional_ptr<duckdb::PhysicalOperator,_true> *)&local_158);
      _Var20._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
           (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
           local_158.type_._0_8_;
    }
    else {
      pPVar19 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
                operator->(&this->physical_plan);
      _Var20._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
           PhysicalPlan::
           Make<duckdb::PhysicalAsOfJoin,duckdb::LogicalComparisonJoin&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&>
                     (pPVar19,op,local_e0,local_118);
    }
  }
  else {
    local_48 = this;
    if ((op->super_LogicalJoin).right_projection_map.
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (op->super_LogicalJoin).right_projection_map.
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this_01 = &(op->super_LogicalJoin).right_projection_map;
      pLVar5 = (local_118->types).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start;
      pLVar6 = (local_118->types).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish;
      __n = (undefined1 *)(((long)pLVar6 - (long)pLVar5 >> 3) * -0x5555555555555555);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (&this_01->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                 (size_type)__n);
      local_158.type_._0_8_ = (PhysicalOperator *)0x0;
      if (pLVar6 != pLVar5) {
        do {
          iVar7._M_current =
               (op->super_LogicalJoin).right_projection_map.
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar7._M_current ==
              (op->super_LogicalJoin).right_projection_map.
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_01,iVar7,
                       (unsigned_long *)&local_158);
          }
          else {
            *iVar7._M_current = local_158.type_._0_8_;
            (op->super_LogicalJoin).right_projection_map.
            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar7._M_current + 1;
          }
          local_158.type_._0_8_ =
               (long)&((BaseExpression *)local_158.type_._0_8_)->_vptr_BaseExpression + 1;
        } while ((ulong)local_158.type_._0_8_ < __n);
      }
    }
    pvVar14 = vector<duckdb::JoinCondition,_true>::operator[](local_110,sVar24);
    puVar1 = &pvVar14->right;
    pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar1);
    LogicalType::LogicalType(&local_70,&pEVar16->return_type);
    local_108.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
    .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_ = 0x84;
    local_158.type_._0_8_ =
         (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
    local_d8.type_.id_ = INVALID;
    local_d8.type_.physical_type_ = ~INVALID;
    local_d8.type_._2_6_ = 0;
    make_uniq<duckdb::BoundWindowExpression,duckdb::ExpressionType,duckdb::LogicalType&,decltype(nullptr),decltype(nullptr)>
              ((ExpressionType *)&local_160,(LogicalType *)&local_108,(void **)&local_70,
               (void **)&local_158);
    pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&local_160);
    pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar1);
    (*(pEVar16->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_158,pEVar16);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&pBVar17->children,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_158);
    if ((Expression *)local_158.type_._0_8_ != (Expression *)0x0) {
      (*(*(_func_int ***)local_158.type_._0_8_)[1])();
    }
    Value::BIGINT(&local_d8,1);
    _Var18._M_head_impl = (Expression *)operator_new(0x98);
    Value::Value(&local_158,&local_d8);
    BoundConstantExpression::BoundConstantExpression
              ((BoundConstantExpression *)_Var18._M_head_impl,&local_158);
    local_e8 = pvVar14;
    local_50 = puVar1;
    Value::~Value(&local_158);
    pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&local_160);
    _Var21._M_head_impl =
         (pBVar17->offset_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar17->offset_expr).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var18._M_head_impl;
    local_58 = op;
    if (_Var21._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var21._M_head_impl)->super_BaseExpression + 8))();
    }
    Value::~Value(&local_d8);
    iVar7._M_current = iStack_90._M_current;
    if (local_98 != iStack_90._M_current) {
      psVar23 = local_98;
      do {
        sVar24 = *psVar23;
        pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                                *)&local_160);
        pvVar14 = vector<duckdb::JoinCondition,_true>::operator[](local_110,sVar24);
        pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(&pvVar14->right);
        (*(pEVar16->super_BaseExpression)._vptr_BaseExpression[0x11])
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_158,pEVar16);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&pBVar17->partitions,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_158);
        if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
            local_158.type_._0_8_ != (Expression *)0x0) {
          (*(*(_func_int ***)local_158.type_._0_8_)[1])();
        }
        psVar23 = psVar23 + 1;
      } while (psVar23 != iVar7._M_current);
    }
    pPVar8 = local_48;
    puVar1 = local_50;
    args = local_58;
    switch(local_e8->comparison) {
    case COMPARE_LESSTHAN:
    case COMPARE_LESSTHANOREQUALTO:
      pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&local_160);
      local_d8.type_.id_ = ANY;
      local_108.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_ = UNKNOWN;
      pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar1);
      (*(pEVar16->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_158,pEVar16);
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                 &pBVar17->orders,(OrderType *)&local_d8,(OrderByNullType *)&local_108,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_158);
      if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          local_158.type_._0_8_ != (Expression *)0x0) {
        (*(*(_func_int ***)local_158.type_._0_8_)[1])();
      }
      Value::NegativeInfinity(&local_d8,&local_70);
      _Var21._M_head_impl = (Expression *)operator_new(0x98);
      Value::Value(&local_158,&local_d8);
      BoundConstantExpression::BoundConstantExpression
                ((BoundConstantExpression *)_Var21._M_head_impl,&local_158);
      Value::~Value(&local_158);
      pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&local_160);
      break;
    case COMPARE_GREATERTHAN:
    case COMPARE_GREATERTHANOREQUALTO:
      pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&local_160);
      local_d8.type_.id_ = UNKNOWN;
      local_108.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_ = UNKNOWN;
      pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar1);
      (*(pEVar16->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_158,pEVar16);
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                 &pBVar17->orders,(OrderType *)&local_d8,(OrderByNullType *)&local_108,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_158);
      if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          local_158.type_._0_8_ != (Expression *)0x0) {
        (*(*(_func_int ***)local_158.type_._0_8_)[1])();
      }
      Value::Infinity(&local_d8,&local_70);
      _Var21._M_head_impl = (Expression *)operator_new(0x98);
      Value::Value(&local_158,&local_d8);
      BoundConstantExpression::BoundConstantExpression
                ((BoundConstantExpression *)_Var21._M_head_impl,&local_158);
      Value::~Value(&local_158);
      pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&local_160);
      break;
    default:
      pIVar22 = (InternalException *)__cxa_allocate_exception(0x10);
      local_158.type_._0_8_ = (long)&local_158 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"Invalid ASOF JOIN ordering for WINDOW","");
      InternalException::InternalException(pIVar22,(string *)&local_158);
      __cxa_throw(pIVar22,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    _Var18._M_head_impl =
         (pBVar17->default_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar17->default_expr).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var21._M_head_impl;
    if (_Var18._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var18._M_head_impl)->super_BaseExpression + 8))();
    }
    Value::~Value(&local_d8);
    pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&local_160);
    pBVar17->start = UNBOUNDED_PRECEDING;
    pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&local_160);
    pBVar17->end = CURRENT_ROW_ROWS;
    local_d8.type_.id_ = INVALID;
    local_d8.type_.physical_type_ = ~INVALID;
    local_d8.type_._2_6_ = 0;
    local_d8.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_d8.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::BoundWindowExpression,std::default_delete<duckdb::BoundWindowExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_d8,
               (unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                *)&local_160);
    pvVar11 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::operator[](local_78,1);
    pLVar12 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->(pvVar11);
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalType&>
              ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&pLVar12->types,
               &local_70);
    pPVar19 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
              operator->(&pPVar8->physical_plan);
    args_2 = PhysicalPlan::
             Make<duckdb::PhysicalWindow,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                       (pPVar19,&pLVar12->types,
                        (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                         *)&local_d8,&local_40);
    __position._M_current =
         (args_2->children).
         super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
         .
         super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (args_2->children).
        super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
      ::_M_realloc_insert<duckdb::PhysicalOperator&>
                ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                  *)&args_2->children,__position,local_118);
    }
    else {
      (__position._M_current)->_M_data = local_118;
      (args_2->children).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    local_108.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
    .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
    pBStack_100 = (BoundReferenceExpression *)0x0;
    pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(&local_e8->left);
    (*(pEVar16->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_158,pEVar16);
    local_108.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
    .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         local_158.type_._0_8_;
    pLVar5 = (pLVar12->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pLVar6 = (pLVar12->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_02 = (BoundReferenceExpression *)operator_new(0x60);
    LogicalType::LogicalType(&local_158.type_,&local_70);
    BoundReferenceExpression::BoundReferenceExpression
              (this_02,&local_158.type_,((long)pLVar5 - (long)pLVar6 >> 3) * -0x5555555555555555 - 1
              );
    LogicalType::~LogicalType(&local_158.type_);
    pBStack_100 = this_02;
    if (3 < (byte)(local_e8->comparison - COMPARE_LESSTHAN)) {
      pIVar22 = (InternalException *)__cxa_allocate_exception(0x10);
      local_158.type_._0_8_ = (long)&local_158 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"Invalid ASOF JOIN comparison for IEJoin","");
      InternalException::InternalException(pIVar22,(string *)&local_158);
      __cxa_throw(pIVar22,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_f8 = '9' - local_e8->comparison;
    ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
    emplace_back<duckdb::JoinCondition>
              (&local_110->
                super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
               (JoinCondition *)&local_108);
    pPVar19 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
              operator->(&pPVar8->physical_plan);
    _Var20._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         PhysicalPlan::
         Make<duckdb::PhysicalIEJoin,duckdb::LogicalComparisonJoin&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,duckdb::vector<duckdb::JoinCondition,true>,duckdb::JoinType&,unsigned_long&>
                   (pPVar19,args,local_e0,args_2,local_110,
                    &(args->super_LogicalJoin).super_LogicalOperator.field_0x61,&local_38);
    if (pBStack_100 != (BoundReferenceExpression *)0x0) {
      (*(pBStack_100->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
    }
    pBStack_100 = (BoundReferenceExpression *)0x0;
    if (local_108.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
        (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
      (*(*(_func_int ***)
          local_108.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)[1])();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_d8);
    if (local_160._M_head_impl != (BoundWindowExpression *)0x0) {
      (*((local_160._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])()
      ;
    }
    LogicalType::~LogicalType(&local_70);
  }
  if (local_98 != (size_type *)0x0) {
    operator_delete(local_98);
  }
  return (PhysicalOperator *)
         (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         _Var20._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::PlanAsOfJoin(LogicalComparisonJoin &op) {
	// now visit the children
	D_ASSERT(op.children.size() == 2);
	idx_t lhs_cardinality = op.children[0]->EstimateCardinality(context);
	idx_t rhs_cardinality = op.children[1]->EstimateCardinality(context);
	auto &left = CreatePlan(*op.children[0]);
	auto &right = CreatePlan(*op.children[1]);

	//	Validate
	vector<idx_t> equi_indexes;
	auto asof_idx = op.conditions.size();
	for (size_t c = 0; c < op.conditions.size(); ++c) {
		auto &cond = op.conditions[c];
		switch (cond.comparison) {
		case ExpressionType::COMPARE_EQUAL:
		case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
			equi_indexes.emplace_back(c);
			break;
		case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		case ExpressionType::COMPARE_GREATERTHAN:
		case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		case ExpressionType::COMPARE_LESSTHAN:
			D_ASSERT(asof_idx == op.conditions.size());
			asof_idx = c;
			break;
		default:
			throw InternalException("Invalid ASOF JOIN comparison");
		}
	}
	D_ASSERT(asof_idx < op.conditions.size());

	auto &config = ClientConfig::GetConfig(context);
	if (!config.force_asof_iejoin) {
		if (op.children[0]->has_estimated_cardinality && lhs_cardinality <= config.asof_loop_join_threshold) {
			auto result = PlanAsOfLoopJoin(op, left, right);
			if (result) {
				return *result;
			}
		}
		return Make<PhysicalAsOfJoin>(op, left, right);
	}

	//	Strip extra column from rhs projections
	auto &right_projection_map = op.right_projection_map;
	if (right_projection_map.empty()) {
		const auto right_count = right.GetTypes().size();
		right_projection_map.reserve(right_count);
		for (column_t i = 0; i < right_count; ++i) {
			right_projection_map.emplace_back(i);
		}
	}

	//	Debug implementation: IEJoin of Window
	//	LEAD(asof_column, 1, infinity) OVER (PARTITION BY equi_column... ORDER BY asof_column) AS asof_end
	auto &asof_comp = op.conditions[asof_idx];
	auto &asof_column = asof_comp.right;
	auto asof_type = asof_column->return_type;
	auto asof_end = make_uniq<BoundWindowExpression>(ExpressionType::WINDOW_LEAD, asof_type, nullptr, nullptr);
	asof_end->children.emplace_back(asof_column->Copy());
	// TODO: If infinities are not supported for a type, fake them by looking at LHS statistics?
	asof_end->offset_expr = make_uniq<BoundConstantExpression>(Value::BIGINT(1));
	for (auto equi_idx : equi_indexes) {
		asof_end->partitions.emplace_back(op.conditions[equi_idx].right->Copy());
	}
	switch (asof_comp.comparison) {
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
	case ExpressionType::COMPARE_GREATERTHAN:
		asof_end->orders.emplace_back(OrderType::ASCENDING, OrderByNullType::NULLS_FIRST, asof_column->Copy());
		asof_end->default_expr = make_uniq<BoundConstantExpression>(Value::Infinity(asof_type));
		break;
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
	case ExpressionType::COMPARE_LESSTHAN:
		asof_end->orders.emplace_back(OrderType::DESCENDING, OrderByNullType::NULLS_FIRST, asof_column->Copy());
		asof_end->default_expr = make_uniq<BoundConstantExpression>(Value::NegativeInfinity(asof_type));
		break;
	default:
		throw InternalException("Invalid ASOF JOIN ordering for WINDOW");
	}

	asof_end->start = WindowBoundary::UNBOUNDED_PRECEDING;
	asof_end->end = WindowBoundary::CURRENT_ROW_ROWS;

	vector<unique_ptr<Expression>> window_select;
	window_select.emplace_back(std::move(asof_end));

	auto &window_types = op.children[1]->types;
	window_types.emplace_back(asof_type);

	auto &window = Make<PhysicalWindow>(window_types, std::move(window_select), rhs_cardinality);
	window.children.emplace_back(right);

	// IEJoin(left, window, conditions || asof_comp ~op asof_end)
	JoinCondition asof_upper;
	asof_upper.left = asof_comp.left->Copy();
	asof_upper.right = make_uniq<BoundReferenceExpression>(asof_type, window_types.size() - 1);
	switch (asof_comp.comparison) {
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		asof_upper.comparison = ExpressionType::COMPARE_LESSTHAN;
		break;
	case ExpressionType::COMPARE_GREATERTHAN:
		asof_upper.comparison = ExpressionType::COMPARE_LESSTHANOREQUALTO;
		break;
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		asof_upper.comparison = ExpressionType::COMPARE_GREATERTHAN;
		break;
	case ExpressionType::COMPARE_LESSTHAN:
		asof_upper.comparison = ExpressionType::COMPARE_GREATERTHANOREQUALTO;
		break;
	default:
		throw InternalException("Invalid ASOF JOIN comparison for IEJoin");
	}

	op.conditions.emplace_back(std::move(asof_upper));
	return Make<PhysicalIEJoin>(op, left, window, std::move(op.conditions), op.join_type, lhs_cardinality);
}